

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtrace.c
# Opt level: O3

int libtest_debug_cb(CURL *handle,curl_infotype type,uchar *data,size_t size,void *userp)

{
  int iVar1;
  FILE *__stream;
  uchar uVar2;
  time_t tVar3;
  tm *ptVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uchar *puVar11;
  timeval tVar12;
  char timebuf [20];
  time_t secs;
  undefined1 local_58 [32];
  long local_38;
  
  local_58[0] = 0;
  if (*userp != 0) {
    tVar12 = tutil_tvnow();
    if (known_offset != '\x01') {
      tVar3 = time((time_t *)0x0);
      epoch_offset = tVar3 - tVar12.tv_sec;
      known_offset = '\x01';
    }
    local_38 = epoch_offset + tVar12.tv_sec;
    ptVar4 = localtime(&local_38);
    curl_msnprintf(local_58,0x14,"%02d:%02d:%02d.%06ld ",ptVar4->tm_hour,ptVar4->tm_min,
                   ptVar4->tm_sec,tVar12.tv_usec);
  }
  __stream = _stderr;
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(_stderr,"%s== Info: %s",local_58,data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar5 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar5 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar5 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar5 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar5 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar5 = "=> Send SSL data";
    break;
  default:
    goto switchD_00102c9a_default;
  }
  iVar1 = *(int *)((long)userp + 4);
  curl_mfprintf(_stderr,"%s%s, %zu bytes (0x%zx)\n",local_58,pcVar5,size,size);
  if (size != 0) {
    lVar6 = 0x40;
    if (iVar1 == 0) {
      lVar6 = 0x10;
    }
    uVar10 = 0;
    do {
      curl_mfprintf(__stream,"%04zx: ",uVar10);
      uVar8 = uVar10;
      lVar7 = lVar6;
      if (iVar1 == 0) {
        do {
          if (uVar8 < size) {
            curl_mfprintf(__stream,"%02x ",data[uVar8]);
          }
          else {
            fputs("   ",__stream);
          }
          lVar7 = lVar7 + -1;
          uVar8 = uVar8 + 1;
        } while (lVar7 != 0);
      }
      lVar7 = 0;
      lVar9 = 0;
      puVar11 = data + 2;
      do {
        if (size <= uVar10 + lVar9) break;
        if (iVar1 == 0) {
          uVar2 = puVar11[uVar10 - 2];
          if ((char)uVar2 < ' ') {
            uVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",uVar2);
        }
        else {
          uVar2 = puVar11[uVar10 - 2];
          if ((uVar10 + lVar9 + 1 < size) && (uVar2 == '\r')) {
            uVar2 = '.';
            if (puVar11[uVar10 - 1] == '\n') {
              uVar10 = (uVar10 - lVar7) - 0x3e;
              break;
            }
          }
          else if ((char)uVar2 < ' ') {
            uVar2 = '.';
          }
          curl_mfprintf(__stream,"%c",uVar2);
          if (((uVar10 + lVar9 + 2 < size) && (puVar11[uVar10 - 1] == '\r')) &&
             (puVar11[uVar10] == '\n')) {
            uVar10 = (uVar10 - lVar7) - 0x3d;
            break;
          }
        }
        lVar9 = lVar9 + 1;
        lVar7 = lVar7 + -1;
        puVar11 = puVar11 + 1;
      } while (-lVar6 != lVar7);
      fputc(10,__stream);
      uVar10 = uVar10 + lVar6;
    } while (uVar10 < size);
  }
  fflush(__stream);
switchD_00102c9a_default:
  return 0;
}

Assistant:

int libtest_debug_cb(CURL *handle, curl_infotype type,
                     unsigned char *data, size_t size,
                     void *userp)
{

  struct libtest_trace_cfg *trace_cfg = userp;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  char *timestr;
  time_t secs;

  (void)handle;

  timebuf[0] = '\0';
  timestr = &timebuf[0];

  if(trace_cfg->tracetime) {
    struct tm *now;
    tv = tutil_tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    msnprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
              now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(stderr, "%s== Info: %s", timestr, (char *)data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  }

  libtest_debug_dump(timebuf, text, stderr, data, size, trace_cfg->nohex);
  return 0;
}